

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDCompressionState<float>::FlushVector(AlpRDCompressionState<float> *this)

{
  ushort uVar1;
  data_ptr_t pdVar2;
  uint uVar3;
  idx_t iVar4;
  long lVar5;
  ulong __n;
  
  *(uint16_t *)this->data_ptr = (this->state).exceptions_count;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 2;
  switchD_00b03519::default
            (pdVar2 + 2,(this->state).left_parts_encoded,(this->state).left_bit_packed_size);
  pdVar2 = this->data_ptr;
  iVar4 = (this->state).left_bit_packed_size;
  this->data_ptr = pdVar2 + iVar4;
  switchD_00b03519::default
            (pdVar2 + iVar4,(this->state).right_parts_encoded,(this->state).right_bit_packed_size);
  iVar4 = (this->state).right_bit_packed_size;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + iVar4;
  uVar1 = (this->state).exceptions_count;
  if (uVar1 == 0) {
    lVar5 = 0;
  }
  else {
    switchD_00b03519::default(pdVar2 + iVar4,(this->state).exceptions,(ulong)((uint)uVar1 * 2));
    __n = (ulong)((uint)(this->state).exceptions_count * 2);
    pdVar2 = this->data_ptr;
    this->data_ptr = pdVar2 + __n;
    switchD_00b03519::default(pdVar2 + __n,(this->state).exceptions_positions,__n);
    uVar1 = (this->state).exceptions_count;
    this->data_ptr = this->data_ptr + ((uint)uVar1 + (uint)uVar1);
    iVar4 = (this->state).right_bit_packed_size;
    lVar5 = (ulong)uVar1 << 2;
  }
  this->data_bytes_used =
       iVar4 + (this->state).left_bit_packed_size + this->data_bytes_used + lVar5 + 2;
  pdVar2 = this->metadata_ptr;
  this->metadata_ptr = pdVar2 + -4;
  *(uint32_t *)(pdVar2 + -4) = this->next_vector_byte_index_start;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    ((ulong)(this->actual_dictionary_size_bytes + 7) + this->data_bytes_used);
  this->next_vector_byte_index_start = uVar3;
  this->vectors_flushed = this->vectors_flushed + 1;
  (this->state).exceptions_count = 0;
  (this->state).left_bit_packed_size = 0;
  (this->state).right_bit_packed_size = 0;
  this->vector_idx = 0;
  this->nulls_idx = 0;
  return;
}

Assistant:

void FlushVector() {
		Store<uint16_t>(state.exceptions_count, data_ptr);
		data_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

		memcpy((void *)data_ptr, (void *)state.left_parts_encoded, state.left_bit_packed_size);
		data_ptr += state.left_bit_packed_size;

		memcpy((void *)data_ptr, (void *)state.right_parts_encoded, state.right_bit_packed_size);
		data_ptr += state.right_bit_packed_size;

		if (state.exceptions_count > 0) {
			memcpy((void *)data_ptr, (void *)state.exceptions, AlpRDConstants::EXCEPTION_SIZE * state.exceptions_count);
			data_ptr += AlpRDConstants::EXCEPTION_SIZE * state.exceptions_count;
			memcpy((void *)data_ptr, (void *)state.exceptions_positions,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count);
			data_ptr += AlpRDConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count;
		}

		data_bytes_used +=
		    state.left_bit_packed_size + state.right_bit_packed_size +
		    (state.exceptions_count * (AlpRDConstants::EXCEPTION_SIZE + AlpRDConstants::EXCEPTION_POSITION_SIZE)) +
		    AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

		// Write pointer to the vector data (metadata)
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		Store<uint32_t>(next_vector_byte_index_start, metadata_ptr);
		next_vector_byte_index_start = NumericCast<uint32_t>(UsedSpace());

		vectors_flushed++;
		vector_idx = 0;
		nulls_idx = 0;
		ResetVector();
	}